

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_localeCompare(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar1;
  int iVar2;
  JSValue JVar3;
  int cmp;
  JSValue b;
  JSValue a;
  JSValueUnion in_stack_ffffffffffffff58;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_ffffffffffffff68;
  JSValueUnion p1;
  int64_t in_stack_ffffffffffffff70;
  JSValueUnion ctx_01;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  JVar3.tag = in_stack_ffffffffffffff70;
  JVar3.u.float64 = in_stack_ffffffffffffff68.float64;
  JVar3 = JS_ToStringCheckObject(in_stack_ffffffffffffff60,JVar3);
  ctx_01 = JVar3.u;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    val.tag = (int64_t)in_stack_ffffffffffffff60;
    val.u.float64 = in_stack_ffffffffffffff58.float64;
    JVar3 = JS_ToString((JSContext *)0x1bbc54,val);
    ctx_00 = JVar3.u;
    p1 = (JSValueUnion)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      local_30 = js_string_compare((JSContext *)ctx_01.ptr,(JSString *)p1.ptr,(JSString *)ctx_00.ptr
                                  );
      v_00.tag = (int64_t)ctx_01.ptr;
      v_00.u.ptr = p1.ptr;
      JS_FreeValue((JSContext *)ctx_00.ptr,v_00);
      v_01.tag = (int64_t)ctx_01.ptr;
      v_01.u.ptr = p1.ptr;
      JS_FreeValue((JSContext *)ctx_00.ptr,v_01);
      uStack_2c = uStack_c;
      local_28 = 0;
    }
    else {
      v.tag = (int64_t)ctx_01.ptr;
      v.u.ptr = p1.ptr;
      JS_FreeValue((JSContext *)ctx_00.ptr,v);
      local_30 = 0;
      local_28 = 6;
    }
  }
  else {
    local_30 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_string_localeCompare(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue a, b;
    int cmp;

    a = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(a))
        return JS_EXCEPTION;
    b = JS_ToString(ctx, argv[0]);
    if (JS_IsException(b)) {
        JS_FreeValue(ctx, a);
        return JS_EXCEPTION;
    }
    cmp = js_string_compare(ctx, JS_VALUE_GET_STRING(a), JS_VALUE_GET_STRING(b));
    JS_FreeValue(ctx, a);
    JS_FreeValue(ctx, b);
    return JS_NewInt32(ctx, cmp);
}